

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  uint64_t uVar1;
  VectorType VVar2;
  bool bVar3;
  idx_t iVar4;
  Vector *pVVar5;
  reference pvVar6;
  hugeint_t *phVar7;
  hugeint_t *phVar8;
  ExpressionState *pEVar9;
  Vector *in_RDX;
  ExpressionState *in_RSI;
  DataChunk *in_RDI;
  hugeint_t ivalue_1;
  idx_t vindex_1;
  idx_t i_1;
  hugeint_t ivalue;
  idx_t vindex;
  idx_t i;
  hugeint_t *input_data;
  UnifiedVectorFormat vdata;
  idx_t col_idx_1;
  bool result_has_value [2048];
  hugeint_t *result_data;
  idx_t col_idx;
  VectorType result_type;
  Vector *result_vector;
  DataChunk *input;
  size_type in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  ExpressionState *in_stack_fffffffffffff6d8;
  undefined6 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e6;
  undefined1 in_stack_fffffffffffff6e7;
  hugeint_t *in_stack_fffffffffffff6e8;
  reference in_stack_fffffffffffff6f0;
  ulong uVar10;
  Vector *this;
  Vector *in_stack_fffffffffffff718;
  int64_t iVar11;
  Vector *in_stack_fffffffffffff720;
  ExpressionState *local_8d8;
  hugeint_t *local_8b8;
  SelectionVector *local_898;
  UnifiedVectorFormat *in_stack_fffffffffffff790;
  sel_t *in_stack_fffffffffffff798;
  Vector *in_stack_fffffffffffff7a0;
  ulong local_850;
  byte local_848 [2056];
  hugeint_t *local_40;
  Vector *local_38;
  undefined1 local_29;
  Vector *local_28;
  DataChunk *local_20;
  Vector *local_18;
  ExpressionState *local_10;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar4 = DataChunk::ColumnCount((DataChunk *)0x200fffc);
  if (iVar4 == 1) {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               in_stack_fffffffffffff6c8);
    Vector::Reference(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  }
  else {
    local_20 = StandardLeastGreatest<false>::Prepare(local_8,local_10);
    local_28 = StandardLeastGreatest<false>::TargetVector(local_18,local_10);
    local_29 = 2;
    local_38 = (Vector *)0x0;
    while (this = local_38, pVVar5 = (Vector *)DataChunk::ColumnCount((DataChunk *)0x201009a),
          this < pVVar5) {
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                          in_stack_fffffffffffff6c8);
      VVar2 = Vector::GetVectorType(pvVar6);
      if (VVar2 != CONSTANT_VECTOR) {
        local_29 = 0;
      }
      local_38 = (Vector *)&local_38->field_0x1;
    }
    local_40 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x20100f5);
    memset(local_848,0,0x800);
    local_850 = 0;
    while (uVar10 = local_850, iVar4 = DataChunk::ColumnCount((DataChunk *)0x2010137),
          uVar10 < iVar4) {
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                          in_stack_fffffffffffff6c8);
      VVar2 = Vector::GetVectorType(pvVar6);
      if (VVar2 == CONSTANT_VECTOR) {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)
                   CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   in_stack_fffffffffffff6c8);
        bVar3 = ConstantVector::IsNull((Vector *)0x2010186);
        if (!bVar3) goto LAB_02010191;
      }
      else {
LAB_02010191:
        UnifiedVectorFormat::UnifiedVectorFormat
                  ((UnifiedVectorFormat *)
                   CONCAT17(in_stack_fffffffffffff6e7,
                            CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)));
        in_stack_fffffffffffff6f0 =
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)
                        CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                        in_stack_fffffffffffff6c8);
        DataChunk::size(local_20);
        Vector::ToUnifiedFormat
                  (in_stack_fffffffffffff7a0,(idx_t)in_stack_fffffffffffff798,
                   in_stack_fffffffffffff790);
        phVar7 = UnifiedVectorFormat::GetData<duckdb::hugeint_t>((UnifiedVectorFormat *)&local_898);
        bVar3 = TemplatedValidityMask<unsigned_long>::AllValid
                          ((TemplatedValidityMask<unsigned_long> *)&stack0xfffffffffffff778);
        if (bVar3) {
          local_8d8 = (ExpressionState *)0x0;
          while (in_stack_fffffffffffff6d8 = local_8d8,
                pEVar9 = (ExpressionState *)DataChunk::size(local_20),
                in_stack_fffffffffffff6d8 < pEVar9) {
            iVar4 = SelectionVector::get_index(local_898,(idx_t)local_8d8);
            uVar1 = phVar7[iVar4].lower;
            iVar11 = phVar7[iVar4].upper;
            if (((local_848[(long)local_8d8] & 1) == 0) ||
               (in_stack_fffffffffffff6d7 =
                     GreaterThan::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8),
               (bool)in_stack_fffffffffffff6d7)) {
              local_848[(long)local_8d8] = 1;
              local_40[(long)local_8d8].lower = uVar1;
              local_40[(long)local_8d8].upper = iVar11;
            }
            local_8d8 = (ExpressionState *)((long)&local_8d8->_vptr_ExpressionState + 1);
          }
        }
        else {
          local_8b8 = (hugeint_t *)0x0;
          while (in_stack_fffffffffffff6e8 = local_8b8,
                phVar8 = (hugeint_t *)DataChunk::size(local_20), in_stack_fffffffffffff6e8 < phVar8)
          {
            iVar4 = SelectionVector::get_index(local_898,(idx_t)local_8b8);
            in_stack_fffffffffffff6e7 =
                 TemplatedValidityMask<unsigned_long>::RowIsValid
                           ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffff6d8,
                            CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            if ((bool)in_stack_fffffffffffff6e7) {
              uVar1 = phVar7[iVar4].lower;
              iVar11 = phVar7[iVar4].upper;
              if (((local_848[(long)local_8b8] & 1) == 0) ||
                 (in_stack_fffffffffffff6e6 =
                       GreaterThan::Operation<duckdb::hugeint_t>
                                 ((hugeint_t *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8),
                 (bool)in_stack_fffffffffffff6e6)) {
                local_848[(long)local_8b8] = 1;
                local_40[(long)local_8b8].lower = uVar1;
                local_40[(long)local_8b8].upper = iVar11;
              }
            }
            local_8b8 = (hugeint_t *)((long)&local_8b8->lower + 1);
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat
                  ((UnifiedVectorFormat *)
                   CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      }
      local_850 = local_850 + 1;
    }
    DataChunk::size(local_20);
    VVar2 = (VectorType)(uVar10 >> 0x38);
    StandardLeastGreatest<false>::FinalizeResult
              ((idx_t)in_stack_fffffffffffff6f0,(bool *)in_stack_fffffffffffff6e8,
               (Vector *)
               CONCAT17(in_stack_fffffffffffff6e7,
                        CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)),
               in_stack_fffffffffffff6d8);
    Vector::SetVectorType(this,VVar2);
  }
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}